

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O2

ArrayBuilder<kj::Array<char>_> * __thiscall
kj::ArrayBuilder<kj::Array<char>_>::operator=
          (ArrayBuilder<kj::Array<char>_> *this,ArrayBuilder<kj::Array<char>_> *other)

{
  RemoveConst<kj::Array<char>_> *pRVar1;
  ArrayDisposer *pAVar2;
  
  dispose(this);
  pRVar1 = other->pos;
  this->ptr = other->ptr;
  this->pos = pRVar1;
  pAVar2 = other->disposer;
  this->endPtr = other->endPtr;
  this->disposer = pAVar2;
  other->ptr = (Array<char> *)0x0;
  other->pos = (RemoveConst<kj::Array<char>_> *)0x0;
  other->endPtr = (Array<char> *)0x0;
  return this;
}

Assistant:

ArrayBuilder& operator=(ArrayBuilder&& other) {
    dispose();
    ptr = other.ptr;
    pos = other.pos;
    endPtr = other.endPtr;
    disposer = other.disposer;
    other.ptr = nullptr;
    other.pos = nullptr;
    other.endPtr = nullptr;
    return *this;
  }